

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas_test.hpp
# Opt level: O1

int lucasTest(int n)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [8];
  ulong uVar4;
  int iVar5;
  pointer piVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  pointer piVar10;
  uint uVar11;
  int *__first;
  bool bVar12;
  undefined8 uStack_70;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_68;
  undefined1 *local_60;
  undefined1 auStack_58 [8];
  vector<int,_std::allocator<int>_> factors;
  uint local_38;
  
  if (n == 1) {
    uVar11 = 0xffffffff;
  }
  else if (n == 2) {
    uVar11 = 1;
  }
  else {
    uVar11 = 0;
    if ((n & 1U) != 0) {
      auStack_58 = (undefined1  [8])0x0;
      factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      uStack_70 = 0x109db4;
      primeFactors(n + -1,(vector<int,_std::allocator<int>_> *)auStack_58);
      lVar2 = -((ulong)(n - 3) * 4 + 0xf & 0xfffffffffffffff0);
      __first = (int *)((long)&local_68 + lVar2);
      piVar10 = (pointer)(ulong)(n - 2);
      local_60 = (undefined1 *)&local_68;
      if (2 < n) {
        piVar6 = (pointer)0x0;
        local_60 = (undefined1 *)&local_68;
        do {
          __first[(long)piVar6] = (int)piVar6 + 2;
          piVar6 = (pointer)((long)piVar6 + 1);
        } while (piVar10 != piVar6);
      }
      *(undefined8 *)((long)&uStack_70 + lVar2) = 0x109df4;
      uVar4 = time((time_t *)0x0);
      local_68._M_x = uVar4 % 0x7fffffff + (ulong)(uVar4 % 0x7fffffff == 0);
      *(undefined8 *)((long)&uStack_70 + lVar2) = 0x109e43;
      std::shuffle<int*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                (__first,__first + (long)n + -3,&local_68);
      auVar3 = auStack_58;
      if (2 < n) {
        uVar4 = (long)factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start - (long)auStack_58 >> 2;
        piVar6 = (pointer)0x0;
        factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = piVar10;
        do {
          iVar1 = __first[(long)piVar6];
          iVar5 = 2;
          iVar7 = iVar1;
          do {
            iVar7 = (iVar7 * iVar1) % n;
            iVar5 = iVar5 + 1;
          } while (n != iVar5);
          bVar12 = iVar7 == 1;
          bVar9 = (undefined1  [8])
                  factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != auStack_58 && bVar12;
          if ((undefined1  [8])
              factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != auStack_58 && bVar12) {
            uVar8 = 0;
            bVar9 = (long)factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start - (long)auStack_58 != 0;
            do {
              iVar5 = (n + -1) / *(int *)((long)auStack_58 + uVar8 * 4);
              iVar7 = iVar1;
              if (1 < iVar5) {
                iVar5 = iVar5 + -1;
                do {
                  iVar7 = (iVar7 * iVar1) % n;
                  iVar5 = iVar5 + -1;
                } while (iVar5 != 0);
              }
              if (iVar7 == 1) goto LAB_00109eff;
              uVar8 = uVar8 + 1;
              bVar9 = uVar8 < uVar4;
            } while (uVar8 != uVar4 + (uVar4 == 0));
            local_38 = 1;
          }
          else {
            local_38 = (uint)bVar12;
          }
LAB_00109eff:
          if (!bVar9) goto LAB_00109f1d;
          piVar6 = (pointer)((long)piVar6 + 1);
        } while (piVar6 != piVar10);
      }
      local_38 = 0xffffffff;
LAB_00109f1d:
      uVar11 = local_38;
      if (auStack_58 != (undefined1  [8])0x0) {
        uVar4 = (long)factors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)auStack_58;
        *(undefined8 *)(local_60 + -8) = 0x109f36;
        operator_delete((void *)auVar3,uVar4);
      }
    }
  }
  return uVar11;
}

Assistant:

inline int lucasTest(int n)
{
    // Base cases
    if (n == 1)
        return -1;
    if (n == 2)
        return 1; // Prime 
    if (n % 2 == 0)
        return 0; // Composite 

    // Generating and storing factors
    // of n-1
    std::vector<int> factors;
    primeFactors(n - 1, factors);
 
    // Array for random generator. This array
    // is to ensure one number is generated
    // only once
    int random[n - 3];
    for (int i = 0; i < n - 2; i++)
        random[i] = i + 2;
         
    // shuffle random array to produce randomness
    std::shuffle(random, random + n - 3, std::default_random_engine(time(0)));
 
    // Now one by one perform Lucas Primality
    // Test on random numbers generated.
    for (int i = 0; i < n - 2; ++i) {
        int a = random[i];
        if (power(a, n - 1, n) != 1)
            return 0; // composite
 
        // this is to check if every factor
        // of n-1 satisfy the condition
        bool flag = true;
        for (int k = 0; k < factors.size(); k++) {
            // if a^((n-1)/q) equal 1
            if (power(a, (n - 1) / factors[k], n) == 1) {
                flag = false;
                break;
            }
        }
 
        // if all condition satisfy
        if (flag)
            return 1; // prime
    }
    return -1; // probably composite
}